

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O2

String * __thiscall
Rml::Element::GetInnerRML_abi_cxx11_(String *__return_storage_ptr__,Element *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  (*(this->super_ScriptInterface).super_Releasable._vptr_Releasable[8])(this,__return_storage_ptr__)
  ;
  return __return_storage_ptr__;
}

Assistant:

String Element::GetInnerRML() const
{
	String result;
	GetInnerRML(result);
	return result;
}